

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O3

void acmod_free(acmod_t *acmod)

{
  ps_mgau_t *ppVar1;
  
  if (acmod != (acmod_t *)0x0) {
    feat_free(acmod->fcb);
    fe_free(acmod->fe);
    ps_config_free(acmod->config);
    if (acmod->mfc_buf != (mfcc_t **)0x0) {
      ckd_free_2d(acmod->mfc_buf);
    }
    if (acmod->feat_buf != (mfcc_t ***)0x0) {
      feat_array_free(acmod->feat_buf);
    }
    if ((FILE *)acmod->mfcfh != (FILE *)0x0) {
      fclose((FILE *)acmod->mfcfh);
    }
    if ((FILE *)acmod->rawfh != (FILE *)0x0) {
      fclose((FILE *)acmod->rawfh);
    }
    if ((FILE *)acmod->senfh != (FILE *)0x0) {
      fclose((FILE *)acmod->senfh);
    }
    ckd_free(acmod->framepos);
    ckd_free(acmod->senone_scores);
    ckd_free(acmod->senone_active_vec);
    ckd_free(acmod->senone_active);
    if (acmod->mdef != (bin_mdef_t *)0x0) {
      bin_mdef_free(acmod->mdef);
    }
    if (acmod->tmat != (tmat_t *)0x0) {
      tmat_free(acmod->tmat);
    }
    ppVar1 = acmod->mgau;
    if (ppVar1 != (ps_mgau_t *)0x0) {
      (*ppVar1->vt->free)(ppVar1);
    }
    if (acmod->mllr != (ps_mllr_t *)0x0) {
      ps_mllr_free(acmod->mllr);
    }
    logmath_free(acmod->lmath);
    ckd_free(acmod);
    return;
  }
  return;
}

Assistant:

void
acmod_free(acmod_t *acmod)
{
    if (acmod == NULL)
        return;

    feat_free(acmod->fcb);
    fe_free(acmod->fe);
    ps_config_free(acmod->config);

    if (acmod->mfc_buf)
        ckd_free_2d((void **)acmod->mfc_buf);
    if (acmod->feat_buf)
        feat_array_free(acmod->feat_buf);

    if (acmod->mfcfh)
        fclose(acmod->mfcfh);
    if (acmod->rawfh)
        fclose(acmod->rawfh);
    if (acmod->senfh)
        fclose(acmod->senfh);

    ckd_free(acmod->framepos);
    ckd_free(acmod->senone_scores);
    ckd_free(acmod->senone_active_vec);
    ckd_free(acmod->senone_active);

    if (acmod->mdef)
        bin_mdef_free(acmod->mdef);
    if (acmod->tmat)
        tmat_free(acmod->tmat);
    if (acmod->mgau)
        ps_mgau_free(acmod->mgau);
    if (acmod->mllr)
        ps_mllr_free(acmod->mllr);
    logmath_free(acmod->lmath);

    ckd_free(acmod);
}